

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O2

void ANMS(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
         vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners)

{
  pointer pKVar1;
  pointer pKVar2;
  const_iterator __position;
  float *pfVar3;
  pointer pKVar4;
  long lVar5;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range1;
  float fVar6;
  float local_94;
  float response;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> r;
  KeyPoint local_68;
  vector<float,_std::allocator<float>_> robustResponse;
  
  robustResponse.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  robustResponse.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  robustResponse.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pKVar1 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_94 = 0.0;
  for (; pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
    fVar6 = pKVar4->response;
    local_68.pt.x = fVar6 * 0.9;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&robustResponse,(float *)&local_68);
    if (fVar6 <= local_94) {
      fVar6 = local_94;
    }
    local_94 = fVar6;
  }
  pKVar1 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
                super__Vector_impl_data._M_start; pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
    local_68.pt.x = (pKVar4->pt).x;
    local_68.pt.y = (pKVar4->pt).y;
    if (pKVar4->response <= local_94 * 0.9) {
      pKVar2 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = &(pKVar2->pt).y;
      local_68.response = 3.4028235e+38;
      for (lVar5 = 0;
          ((long)(keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)pKVar2) / 0x1c != lVar5;
          lVar5 = lVar5 + 1) {
        fVar6 = local_68.response;
        if ((pKVar4->response <
             robustResponse.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5]) &&
           (fVar6 = ((Point2f *)(pfVar3 + -1))->x - local_68.pt.x,
           fVar6 = SQRT(fVar6 * fVar6 + (*pfVar3 - local_68.pt.y) * (*pfVar3 - local_68.pt.y)),
           local_68.response <= fVar6)) {
          fVar6 = local_68.response;
        }
        pfVar3 = pfVar3 + 7;
        local_68.response = fVar6;
      }
      local_68.size = 3.0;
      local_68.angle = -1.0;
      local_68.octave = 0;
      local_68.class_id = -1;
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                (&r,&local_68);
    }
    else {
      local_68.size = 3.0;
      local_68.angle = -1.0;
      local_68.response = 3.4028235e+38;
      local_68.octave = 0;
      local_68.class_id = -1;
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                (&r,&local_68);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>>
            ((__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
              )r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
              )r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_cv::KeyPoint_&,_const_cv::KeyPoint_&)>)0x103784);
  __position._M_current =
       (corners->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
       super__Vector_impl_data._M_start;
  if ((ulong)(((long)r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x1c) < 0x1f5) {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,void>
              ((vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners,__position,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  else {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,void>
              ((vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners,__position,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_start,
               r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start + 499);
  }
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
            (&r.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&robustResponse.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void ANMS(std::vector<KeyPoint>& keyPoint, std::vector<KeyPoint>& corners) {
	const int n = 500;
	const float robustC = 0.9F;

	vector<float> robustResponse;
	vector<KeyPoint> r;


	float globalMax = 0.0F;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		robustResponse.push_back(response*robustC);
		if (response > globalMax) {
			globalMax = response;
		}
	}

	globalMax *= robustC;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		if (response > globalMax) {
			r.push_back(KeyPoint(point.pt, 3, -1.0F, numeric_limits<float>::max()));
		}
		else {
			float minDist = numeric_limits<float>::max();
			for (int i = 0; i < keyPoint.size(); ++i) {
				float resP = robustResponse[i];
				if (resP > response) {
					float dist = getDistance(keyPoint[i], point);
					if (dist < minDist) {
						minDist = dist;
					}
				}
			}
			r.push_back(KeyPoint(point.pt, 3, -1.0F, minDist));
		}
	}

	sort(r.begin(), r.end(), compDist);
	if (r.size() > n) {
		corners.insert(corners.begin(), r.begin(), r.begin() + n - 1);
	}
	else {
		corners.insert(corners.begin(), r.begin(), r.end());
	}

}